

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_traits.hpp
# Opt level: O3

void jsoncons::
     encode_traits<std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>,char,void>
     ::encode<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                *val,basic_json_visitor<char> *encoder,
               basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *proto,
               error_code *ec)

{
  _Rb_tree_node_base *p_Var1;
  string_view_type local_48;
  ser_context local_38;
  
  local_48._M_len = (size_t)&PTR__ser_context_00b2f9c8;
  (*encoder->_vptr_basic_json_visitor[4])
            (encoder,(val->_M_t)._M_impl.super__Rb_tree_header._M_node_count,0,&local_48,ec);
  if (ec->_M_value == 0) {
    for (p_Var1 = (val->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var1 != &(val->_M_t)._M_impl.super__Rb_tree_header;
        p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
      local_48._M_str = *(char **)(p_Var1 + 1);
      local_48._M_len = (size_t)p_Var1[1]._M_parent;
      local_38._vptr_ser_context = (_func_int **)&PTR__ser_context_00b2f9c8;
      basic_json_visitor<char>::key(encoder,&local_48,&local_38);
      local_48._M_len = (size_t)&PTR__ser_context_00b2f9c8;
      (*encoder->_vptr_basic_json_visitor[0x12])(*(undefined8 *)(p_Var1 + 2),encoder,0,&local_48,ec)
      ;
      if (ec->_M_value != 0) {
        return;
      }
    }
    local_48._M_len = (size_t)&PTR__ser_context_00b2f9c8;
    (*encoder->_vptr_basic_json_visitor[5])(encoder,&local_48,ec);
  }
  return;
}

Assistant:

static void encode(const T& val, 
                           basic_json_visitor<CharT>& encoder, 
                           const Json& proto, 
                           std::error_code& ec)
        {
            encoder.begin_object(val.size(), semantic_tag::none, ser_context(), ec);
            if (JSONCONS_UNLIKELY(ec)) {return;}
            for (auto it = std::begin(val); it != std::end(val); ++it)
            {
                encoder.key((*it).first);
                encode_traits<mapped_type,CharT>::encode((*it).second, encoder, proto, ec);
                if (JSONCONS_UNLIKELY(ec)) {return;}
            }
            encoder.end_object(ser_context(), ec);
            if (JSONCONS_UNLIKELY(ec)) {return;}
        }